

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9a29d0;
  *(undefined8 *)&this->field_0x70 = 0x9a2a20;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x9a29f8;
  puVar1 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48;
  if (puVar1 != &this->field_0x58) {
    operator_delete(puVar1,*(long *)&this->field_0x58 + 1);
  }
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9a2a48;
  *(undefined8 *)&this->field_0x70 = 0x9a2a70;
  puVar2 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
  puVar1 = &(this->super_IfcNamedUnit).field_0x28;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x88);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}